

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

_Bool arm_tr_breakpoint_check(DisasContextBase *dcbase,CPUState *cpu,CPUBreakpoint *bp)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGContext_conflict1 *tcg_ctx;
  DisasContextBase *__mptr;
  DisasContext_conflict1 *dc;
  CPUBreakpoint *bp_local;
  CPUState *cpu_local;
  DisasContextBase *dcbase_local;
  
  tcg_ctx_00 = *(TCGContext_conflict1 **)(dcbase[8].pc_next + 0x2e8);
  if ((bp->flags & 0x20U) == 0) {
    gen_exception_internal_insn((DisasContext_conflict1 *)dcbase,(uint32_t)dcbase->pc_next,0x10002);
    dcbase->pc_next = dcbase->pc_next + 2;
    dcbase->is_jmp = DISAS_NORETURN;
  }
  else {
    gen_set_condexec((DisasContext_conflict1 *)dcbase);
    gen_set_pc_im((DisasContext_conflict1 *)dcbase,dcbase->pc_next);
    gen_helper_check_breakpoints(tcg_ctx_00,tcg_ctx_00->cpu_env);
    dcbase->is_jmp = DISAS_TOO_MANY;
  }
  return true;
}

Assistant:

static bool arm_tr_breakpoint_check(DisasContextBase *dcbase, CPUState *cpu,
                                    const CPUBreakpoint *bp)
{
    DisasContext *dc = container_of(dcbase, DisasContext, base);
    TCGContext *tcg_ctx = dc->uc->tcg_ctx;

    if (bp->flags & BP_CPU) {
        gen_set_condexec(dc);
        gen_set_pc_im(dc, dc->base.pc_next);
        gen_helper_check_breakpoints(tcg_ctx, tcg_ctx->cpu_env);
        /* End the TB early; it's likely not going to be executed */
        dc->base.is_jmp = DISAS_TOO_MANY;
    } else {
        gen_exception_internal_insn(dc, dc->base.pc_next, EXCP_DEBUG);
        /* The address covered by the breakpoint must be
           included in [tb->pc, tb->pc + tb->size) in order
           to for it to be properly cleared -- thus we
           increment the PC here so that the logic setting
           tb->size below does the right thing.  */
        /* TODO: Advance PC by correct instruction length to
         * avoid disassembler error messages */
        dc->base.pc_next += 2;
        dc->base.is_jmp = DISAS_NORETURN;
    }

    return true;
}